

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::SPxMainSM<double>::multiaggregation
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  double dVar1;
  uint uVar2;
  DLPSV *pDVar3;
  DLPSV *pDVar4;
  pointer pdVar5;
  pointer pdVar6;
  SPxLPBase<double> *pSVar7;
  bool bVar8;
  int iVar9;
  Verbosity VVar10;
  double *pdVar11;
  SVectorBase<double> *pSVar12;
  char *pcVar13;
  int *piVar14;
  SPxOut *pSVar15;
  SPxOut *manip;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int __c_09;
  int __c_10;
  int __c_11;
  int __c_12;
  int __c_13;
  int __c_14;
  undefined1 *in_RDX;
  SPxLPBase<double> *in_RSI;
  SPxMainSM<double> *in_RDI;
  double dVar16;
  undefined1 auVar17 [12];
  Verbosity old_verbosity;
  int l_1;
  int l;
  double updateLhs;
  double updateRhs;
  VectorBase<double> updateRow;
  int rowNumber_1;
  int k_2;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  double aggAij;
  double aggConstant;
  SVectorBase<double> *bestRow;
  double maxVal_1;
  double minVal_1;
  double maxVal;
  double minVal;
  double maxRes;
  double minRes;
  double val;
  bool aggRhs;
  bool aggLhs;
  bool rhsExists;
  bool lhsExists;
  double rhs;
  double lhs;
  int rowNumber;
  int k_1;
  bool bestislhs;
  int bestpos;
  int maxOtherLocks;
  double upper;
  double lower;
  double aij;
  int k;
  SVectorBase<double> *col;
  int j;
  VectorBase<double> downLocks;
  VectorBase<double> upLocks;
  int oldCols;
  int oldRows;
  int remNzos;
  int remCols;
  int remRows;
  MultiAggregationPS *in_stack_fffffffffffffa78;
  SPxLPBase<double> *in_stack_fffffffffffffa80;
  SPxLPBase<double> *in_stack_fffffffffffffa88;
  SPxMainSM<double> *in_stack_fffffffffffffa90;
  SVectorBase<double> *in_stack_fffffffffffffa98;
  SPxMainSM<double> *in_stack_fffffffffffffaa0;
  double *in_stack_fffffffffffffb08;
  double *in_stack_fffffffffffffb10;
  SPxLPBase<double> *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  uint in_stack_fffffffffffffb24;
  double in_stack_fffffffffffffb28;
  double *in_stack_fffffffffffffb30;
  SPxLPBase<double> *in_stack_fffffffffffffb38;
  SPxMainSM<double> *in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffb88;
  uint in_stack_fffffffffffffb8c;
  double *in_stack_fffffffffffffb90;
  SVectorBase<double> *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  uint in_stack_fffffffffffffba4;
  SPxLPBase<double> *in_stack_fffffffffffffba8;
  MultiAggregationPS *in_stack_fffffffffffffbb0;
  SPxLPBase<double> *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  DataKey *in_stack_fffffffffffffbf0;
  SPxLPBase<double> *in_stack_fffffffffffffbf8;
  SPxMainSM<double> *in_stack_fffffffffffffc00;
  DataKey *local_3f0;
  bool local_342;
  bool local_341;
  bool local_329;
  bool local_312;
  bool local_311;
  bool local_2f9;
  undefined4 local_1b0;
  Verbosity local_1ac;
  double local_1a8;
  uint local_19c;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  uint local_174;
  double local_170;
  double local_168;
  uint local_144;
  uint local_140;
  undefined1 local_139;
  undefined1 local_138 [56];
  double local_100;
  DLPSV *local_f8;
  DLPSV *local_f0;
  double local_e8;
  undefined8 local_e0;
  double local_d8;
  pointer local_d0;
  bool local_c4;
  bool local_c3;
  byte local_c2;
  byte local_c1;
  pointer local_c0;
  pointer local_b8;
  undefined4 local_ac;
  uint local_a8;
  byte local_a1;
  int local_a0;
  int local_9c;
  pointer local_98;
  pointer local_90;
  double local_88;
  uint local_7c;
  SVectorBase<double> *local_78;
  int local_70 [17];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  SPxLPBase<double> *local_10;
  
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2b4fbd);
  local_2c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b4fd1);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b4fe5);
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)in_stack_fffffffffffffa90,
             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b5001);
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)in_stack_fffffffffffffa90,
             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
  local_70[0] = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b502d);
LAB_002b5047:
  do {
    local_70[0] = local_70[0] + -1;
    if (local_70[0] < 0) {
      if (0 < local_20 + local_1c) {
        (in_RDI->super_SPxSimplifier<double>).m_remRows =
             local_1c + (in_RDI->super_SPxSimplifier<double>).m_remRows;
        (in_RDI->super_SPxSimplifier<double>).m_remCols =
             local_20 + (in_RDI->super_SPxSimplifier<double>).m_remCols;
        (in_RDI->super_SPxSimplifier<double>).m_remNzos =
             local_24 + (in_RDI->super_SPxSimplifier<double>).m_remNzos;
        if (((in_RDI->super_SPxSimplifier<double>).spxout != (SPxOut *)0x0) &&
           (VVar10 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout),
           3 < (int)VVar10)) {
          local_1ac = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout);
          pSVar15 = (in_RDI->super_SPxSimplifier<double>).spxout;
          local_1b0 = 4;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_1b0);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa80,
                             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa80,
                             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
          pSVar15 = soplex::operator<<((SPxOut *)in_stack_fffffffffffffa80,
                                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          manip = soplex::operator<<(pSVar15,(char *)in_stack_fffffffffffffa78);
          soplex::operator<<(pSVar15,(_func_ostream_ptr_ostream_ptr *)manip);
          pSVar15 = (in_RDI->super_SPxSimplifier<double>).spxout;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_1ac);
        }
        if ((in_RDI->super_SPxSimplifier<double>).m_minReduction * (double)(local_2c + local_28) <
            (double)(local_20 + local_1c)) {
          *local_18 = 1;
        }
      }
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b6df1);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b6dfe);
      return OKAY;
    }
    pdVar11 = VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffffa80,
                         (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
    *pdVar11 = 0.0;
    pdVar11 = VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffffa80,
                         (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
    *pdVar11 = 0.0;
    pSVar12 = SPxLPBase<double>::colVector
                        (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
    iVar9 = SVectorBase<double>::size(pSVar12);
  } while (iVar9 < 2);
  local_78 = SPxLPBase<double>::colVector
                       (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
  for (local_7c = 0; uVar2 = local_7c, iVar9 = SVectorBase<double>::size(local_78),
      (int)uVar2 < iVar9; local_7c = local_7c + 1) {
    pdVar11 = SVectorBase<double>::value(local_78,local_7c);
    local_88 = *pdVar11;
    SVectorBase<double>::index(local_78,(char *)(ulong)local_7c,__c);
    pdVar11 = SPxLPBase<double>::lhs
                        (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
    dVar16 = *pdVar11;
    auVar17 = infinity();
    iVar9 = auVar17._8_4_;
    if (dVar16 <= -*auVar17._0_8_) {
LAB_002b5300:
      SVectorBase<double>::index(local_78,(char *)(ulong)local_7c,iVar9);
      pdVar11 = SPxLPBase<double>::lhs
                          (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20)
                          );
      dVar16 = *pdVar11;
      auVar17 = infinity();
      if (dVar16 <= -*auVar17._0_8_) {
        SVectorBase<double>::index(local_78,(char *)(ulong)local_7c,auVar17._8_4_);
        pdVar11 = SPxLPBase<double>::rhs
                            (in_stack_fffffffffffffa80,
                             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        dVar16 = *pdVar11;
        pdVar11 = (double *)infinity();
        if (dVar16 < *pdVar11) {
          iVar9 = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
          if (local_88 <= 0.0) {
            if (local_88 < 0.0) {
              pdVar11 = VectorBase<double>::operator[]
                                  ((VectorBase<double> *)in_stack_fffffffffffffa80,iVar9);
              *pdVar11 = *pdVar11 + 1.0;
            }
          }
          else {
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,iVar9);
            *pdVar11 = *pdVar11 + 1.0;
          }
        }
      }
      else {
        iVar9 = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
        if (local_88 <= 0.0) {
          if (local_88 < 0.0) {
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,iVar9);
            *pdVar11 = *pdVar11 + 1.0;
          }
        }
        else {
          pdVar11 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)in_stack_fffffffffffffa80,iVar9);
          *pdVar11 = *pdVar11 + 1.0;
        }
      }
    }
    else {
      SVectorBase<double>::index(local_78,(char *)(ulong)local_7c,iVar9);
      pdVar11 = SPxLPBase<double>::rhs
                          (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20)
                          );
      dVar16 = *pdVar11;
      auVar17 = infinity();
      iVar9 = auVar17._8_4_;
      if (*auVar17._0_8_ <= dVar16) goto LAB_002b5300;
      pdVar11 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_fffffffffffffa80,
                           (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      *pdVar11 = *pdVar11 + 1.0;
      pdVar11 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_fffffffffffffa80,
                           (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      *pdVar11 = *pdVar11 + 1.0;
    }
  }
  pdVar11 = VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffffa80,
                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
  if ((*pdVar11 != 1.0) || (NAN(*pdVar11))) goto LAB_002b5572;
  goto LAB_002b55b4;
LAB_002b5572:
  pdVar11 = VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffffa80,
                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
  if ((*pdVar11 == 1.0) && (!NAN(*pdVar11))) {
LAB_002b55b4:
    pdVar11 = SPxLPBase<double>::lower
                        (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
    local_90 = (pointer)*pdVar11;
    pdVar11 = SPxLPBase<double>::upper
                        (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
    local_98 = (pointer)*pdVar11;
    local_a0 = -1;
    local_a1 = 1;
    for (local_a8 = 0; uVar2 = local_a8, iVar9 = SVectorBase<double>::size(local_78),
        (int)uVar2 < iVar9; local_a8 = local_a8 + 1) {
      pdVar11 = SVectorBase<double>::value(local_78,local_a8);
      local_d0 = (pointer)*pdVar11;
      pcVar13 = SVectorBase<double>::index(local_78,(char *)(ulong)local_a8,__c_00);
      local_ac = SUB84(pcVar13,0);
      pdVar11 = SPxLPBase<double>::lhs
                          (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20)
                          );
      local_b8 = (pointer)*pdVar11;
      pdVar11 = SPxLPBase<double>::rhs
                          (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20)
                          );
      local_c0 = (pointer)*pdVar11;
      feastol(in_stack_fffffffffffffaa0);
      bVar8 = EQ<double,double,double>
                        ((double)in_stack_fffffffffffffa80,(double)in_stack_fffffffffffffa78,
                         1.4033529536291e-317);
      pdVar6 = local_b8;
      if (!bVar8) {
        pdVar11 = (double *)infinity();
        pdVar5 = local_c0;
        local_c1 = -*pdVar11 < (double)pdVar6;
        pdVar11 = (double *)infinity();
        local_c2 = (double)pdVar5 < *pdVar11;
        pSVar12 = SPxLPBase<double>::rowVector
                            (in_stack_fffffffffffffa80,
                             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        iVar9 = SVectorBase<double>::size(pSVar12);
        if (iVar9 < 3) {
          local_9c = 0x7fffffff;
        }
        else {
          pSVar12 = SPxLPBase<double>::rowVector
                              (in_stack_fffffffffffffa80,
                               (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          iVar9 = SVectorBase<double>::size(pSVar12);
          if (iVar9 == 3) {
            local_9c = 3;
          }
          else {
            pSVar12 = SPxLPBase<double>::rowVector
                                (in_stack_fffffffffffffa80,
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            iVar9 = SVectorBase<double>::size(pSVar12);
            if (iVar9 == 4) {
              local_9c = 2;
            }
            else {
              local_9c = 1;
            }
          }
        }
        local_2f9 = false;
        if ((local_c1 & 1) != 0) {
          pdVar11 = SVectorBase<double>::value(local_78,local_a8);
          if ((*pdVar11 <= 0.0) ||
             (pdVar11 = SPxLPBase<double>::maxObj
                                  (in_stack_fffffffffffffa80,
                                   (int)((ulong)in_stack_fffffffffffffa78 >> 0x20)), 0.0 < *pdVar11)
             ) {
LAB_002b597e:
            pdVar11 = SVectorBase<double>::value(local_78,local_a8);
            local_312 = false;
            if (*pdVar11 <= 0.0 && *pdVar11 != 0.0) {
              pdVar11 = SPxLPBase<double>::maxObj
                                  (in_stack_fffffffffffffa80,
                                   (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
              local_312 = false;
              if (0.0 <= *pdVar11) {
                pdVar11 = VectorBase<double>::operator[]
                                    ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                     (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                local_312 = false;
                if ((*pdVar11 == 1.0) && (!NAN(*pdVar11))) {
                  pdVar11 = VectorBase<double>::operator[]
                                      ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                  local_312 = *pdVar11 <= (double)local_9c;
                }
              }
            }
            local_311 = local_312;
          }
          else {
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            if ((*pdVar11 != 1.0) || (NAN(*pdVar11))) goto LAB_002b597e;
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            local_311 = true;
            if ((double)local_9c < *pdVar11) goto LAB_002b597e;
          }
          local_2f9 = local_311;
        }
        local_c3 = local_2f9;
        local_329 = false;
        if ((local_c2 & 1) != 0) {
          pdVar11 = SVectorBase<double>::value(local_78,local_a8);
          if ((*pdVar11 <= 0.0) ||
             (pdVar11 = SPxLPBase<double>::maxObj
                                  (in_stack_fffffffffffffa80,
                                   (int)((ulong)in_stack_fffffffffffffa78 >> 0x20)), *pdVar11 < 0.0)
             ) {
LAB_002b5b6a:
            pdVar11 = SVectorBase<double>::value(local_78,local_a8);
            local_342 = false;
            if (*pdVar11 <= 0.0 && *pdVar11 != 0.0) {
              pdVar11 = SPxLPBase<double>::maxObj
                                  (in_stack_fffffffffffffa80,
                                   (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
              local_342 = false;
              if (*pdVar11 <= 0.0) {
                pdVar11 = VectorBase<double>::operator[]
                                    ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                     (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                local_342 = false;
                if ((*pdVar11 == 1.0) && (!NAN(*pdVar11))) {
                  pdVar11 = VectorBase<double>::operator[]
                                      ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                  local_342 = *pdVar11 <= (double)local_9c;
                }
              }
            }
            local_341 = local_342;
          }
          else {
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            if ((*pdVar11 != 1.0) || (NAN(*pdVar11))) goto LAB_002b5b6a;
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            local_341 = true;
            if ((double)local_9c < *pdVar11) goto LAB_002b5b6a;
          }
          local_329 = local_341;
        }
        local_c4 = local_329;
        if (((local_c3 & 1U) != 0) || (local_329 != false)) {
          local_d8 = 0.0;
          local_e0._0_4_ = 0;
          local_e0._4_4_ = 0;
          computeMinMaxResidualActivity
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                     (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),(int)in_stack_fffffffffffffbf0,
                     (double *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                     (double *)in_stack_fffffffffffffbe0);
          if ((local_c3 & 1U) != 0) {
            computeMinMaxValues(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                                (double)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                                (double)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20
                                                ),(double)in_stack_fffffffffffffb18,
                                in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
            dVar16 = local_e8;
            pdVar11 = (double *)infinity();
            pdVar6 = local_90;
            dVar1 = local_e8;
            if (-*pdVar11 < dVar16) {
              dVar16 = feastol(in_stack_fffffffffffffaa0);
              bVar8 = GT<double,double,double>(dVar1,(double)pdVar6,dVar16);
              pDVar3 = local_f0;
              if ((bVar8) &&
                 (pdVar11 = (double *)infinity(), pdVar6 = local_98, pDVar4 = local_f0,
                 (double)pDVar3 < *pdVar11)) {
                dVar16 = feastol(in_stack_fffffffffffffaa0);
                bVar8 = LT<double,double,double>((double)pDVar4,(double)pdVar6,dVar16);
                if (bVar8) {
                  pcVar13 = SVectorBase<double>::index(local_78,(char *)(ulong)local_a8,__c_01);
                  local_a0 = (int)pcVar13;
                  local_a1 = 1;
                  break;
                }
              }
            }
          }
          if ((local_c4 & 1U) != 0) {
            computeMinMaxValues(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                                (double)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                                (double)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20
                                                ),(double)in_stack_fffffffffffffb18,
                                in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
            pDVar3 = local_f8;
            pdVar11 = (double *)infinity();
            pdVar6 = local_90;
            pDVar4 = local_f8;
            if (-*pdVar11 < (double)pDVar3) {
              dVar16 = feastol(in_stack_fffffffffffffaa0);
              bVar8 = GT<double,double,double>((double)pDVar4,(double)pdVar6,dVar16);
              dVar16 = local_100;
              if ((bVar8) &&
                 (pdVar11 = (double *)infinity(), pdVar6 = local_98, dVar1 = local_100,
                 dVar16 < *pdVar11)) {
                dVar16 = feastol(in_stack_fffffffffffffaa0);
                bVar8 = LT<double,double,double>(dVar1,(double)pdVar6,dVar16);
                if (bVar8) {
                  pcVar13 = SVectorBase<double>::index(local_78,(char *)(ulong)local_a8,__c_02);
                  local_a0 = (int)pcVar13;
                  local_a1 = 0;
                  break;
                }
              }
            }
          }
        }
      }
    }
    if (-1 < local_a0) {
      local_138._48_8_ =
           SPxLPBase<double>::rowVector
                     (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      iVar9 = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
      if ((local_a1 & 1) == 0) {
        pdVar11 = SPxLPBase<double>::rhs(in_stack_fffffffffffffa80,iVar9);
        local_3f0 = (DataKey *)*pdVar11;
      }
      else {
        pdVar11 = SPxLPBase<double>::lhs(in_stack_fffffffffffffa80,iVar9);
        local_3f0 = (DataKey *)*pdVar11;
      }
      local_138._40_8_ = local_3f0;
      local_138._32_8_ =
           SVectorBase<double>::operator[]
                     ((SVectorBase<double> *)in_stack_fffffffffffffa88,
                      (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
      SPxOut::
      debug<soplex::SPxMainSM<double>,_const_char_(&)[95],_int_&,_int_&,_double_&,_double_&,_0>
                (in_RDI,(char (*) [95])
                        "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n"
                 ,local_70,&local_a0,(double *)(local_138 + 0x28),(double *)(local_138 + 0x20));
      in_stack_fffffffffffffc00 = (SPxMainSM<double> *)operator_new(0xa0);
      local_139 = 1;
      in_stack_fffffffffffffbf8 = (SPxLPBase<double> *)local_138;
      in_stack_fffffffffffffbe0 = local_10;
      in_stack_fffffffffffffbe8 = local_a0;
      in_stack_fffffffffffffbec = local_70[0];
      in_stack_fffffffffffffbf0 = (DataKey *)local_138._40_8_;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffa80,
                 (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffa78);
      MultiAggregationPS::MultiAggregationPS
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 (SPxMainSM<double> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20),(int)in_stack_fffffffffffffb98,
                 (double)in_stack_fffffffffffffb90,
                 (shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_139 = 0;
      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
      shared_ptr<soplex::SPxMainSM<double>::MultiAggregationPS,void>
                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa78);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b6263);
      Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                 in_stack_fffffffffffffa80,
                 (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)in_stack_fffffffffffffa78);
      for (local_140 = 0; uVar2 = local_140, iVar9 = SVectorBase<double>::size(local_78),
          (int)uVar2 < iVar9; local_140 = local_140 + 1) {
        pcVar13 = SVectorBase<double>::index(local_78,(char *)(ulong)local_140,__c_03);
        if ((int)pcVar13 != local_a0) {
          pcVar13 = SVectorBase<double>::index(local_78,(char *)(ulong)local_140,__c_04);
          local_144 = (uint)pcVar13;
          SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b6301);
          VectorBase<double>::VectorBase
                    ((VectorBase<double> *)in_stack_fffffffffffffa90,
                     (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
          SVectorBase<double>::index(local_78,(char *)(ulong)local_140,__c_05);
          pdVar11 = SPxLPBase<double>::rhs
                              (in_stack_fffffffffffffa80,
                               (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          local_168 = *pdVar11;
          SVectorBase<double>::index(local_78,(char *)(ulong)local_140,__c_06);
          pdVar11 = SPxLPBase<double>::lhs
                              (in_stack_fffffffffffffa80,
                               (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          local_170 = *pdVar11;
          in_stack_fffffffffffffba8 = local_10;
          SVectorBase<double>::index(local_78,(char *)(ulong)local_140,__c_07);
          in_stack_fffffffffffffbb0 =
               (MultiAggregationPS *)
               SPxLPBase<double>::rowVector
                         (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20))
          ;
          VectorBase<double>::operator=
                    ((VectorBase<double> *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          local_174 = 0;
          while (in_stack_fffffffffffffba4 = local_174,
                iVar9 = SVectorBase<double>::size((SVectorBase<double> *)local_138._48_8_),
                (int)in_stack_fffffffffffffba4 < iVar9) {
            pcVar13 = SVectorBase<double>::index
                                ((SVectorBase<double> *)local_138._48_8_,(char *)(ulong)local_174,
                                 __c_08);
            if ((int)pcVar13 != local_70[0]) {
              in_stack_fffffffffffffb98 =
                   SPxLPBase<double>::rowVector
                             (in_stack_fffffffffffffa80,
                              (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
              SVectorBase<double>::index
                        ((SVectorBase<double> *)local_138._48_8_,(char *)(ulong)local_174,__c_09);
              iVar9 = SVectorBase<double>::pos
                                ((SVectorBase<double> *)in_stack_fffffffffffffa88,
                                 (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
              pSVar7 = local_10;
              uVar2 = local_144;
              if (iVar9 < 0) {
                pcVar13 = SVectorBase<double>::index
                                    ((SVectorBase<double> *)local_138._48_8_,
                                     (char *)(ulong)local_174,__c_10);
                pdVar11 = VectorBase<double>::operator[]
                                    ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                     (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                dVar16 = *pdVar11;
                pdVar11 = SVectorBase<double>::value
                                    ((SVectorBase<double> *)local_138._48_8_,local_174);
                local_188 = (-dVar16 * *pdVar11) / (double)local_138._32_8_;
                (*(pSVar7->super_LPRowSetBase<double>).super_SVSetBase<double>.
                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                          (pSVar7,(ulong)uVar2,(ulong)pcVar13 & 0xffffffff,&local_188,0);
              }
              else {
                in_stack_fffffffffffffb88 = local_144;
                pcVar13 = SVectorBase<double>::index
                                    ((SVectorBase<double> *)local_138._48_8_,
                                     (char *)(ulong)local_174,__c_10);
                in_stack_fffffffffffffb8c = (uint)pcVar13;
                SVectorBase<double>::index
                          ((SVectorBase<double> *)local_138._48_8_,(char *)(ulong)local_174,__c_11);
                in_stack_fffffffffffffb90 =
                     VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                dVar16 = *in_stack_fffffffffffffb90;
                pdVar11 = VectorBase<double>::operator[]
                                    ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                     (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
                dVar1 = *pdVar11;
                pdVar11 = SVectorBase<double>::value
                                    ((SVectorBase<double> *)local_138._48_8_,local_174);
                local_180 = dVar16 - (dVar1 * *pdVar11) / (double)local_138._32_8_;
                (*(pSVar7->super_LPRowSetBase<double>).super_SVSetBase<double>.
                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                          (pSVar7,(ulong)in_stack_fffffffffffffb88,(ulong)in_stack_fffffffffffffb8c,
                           &local_180);
              }
            }
            local_174 = local_174 + 1;
          }
          in_stack_fffffffffffffb40 =
               (SPxMainSM<double> *)
               SPxLPBase<double>::rhs
                         (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20))
          ;
          in_stack_fffffffffffffb38 =
               (SPxLPBase<double> *)
               (in_stack_fffffffffffffb40->super_SPxSimplifier<double>)._vptr_SPxSimplifier;
          pdVar11 = (double *)infinity();
          if ((double)in_stack_fffffffffffffb38 < *pdVar11) {
            in_stack_fffffffffffffb18 = local_10;
            in_stack_fffffffffffffb24 = local_144;
            in_stack_fffffffffffffb28 = local_168;
            in_stack_fffffffffffffb30 =
                 VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffa80,
                            (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            local_190 = in_stack_fffffffffffffb28 -
                        (*in_stack_fffffffffffffb30 * (double)local_138._40_8_) /
                        (double)local_138._32_8_;
            (*(in_stack_fffffffffffffb18->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                      (in_stack_fffffffffffffb18,(ulong)in_stack_fffffffffffffb24,&local_190,0);
          }
          in_stack_fffffffffffffb10 =
               SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20))
          ;
          in_stack_fffffffffffffb08 = (double *)*in_stack_fffffffffffffb10;
          pdVar11 = (double *)infinity();
          pSVar7 = local_10;
          uVar2 = local_144;
          dVar16 = local_170;
          if (-*pdVar11 < (double)in_stack_fffffffffffffb08) {
            pdVar11 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_fffffffffffffa80,
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            local_198 = dVar16 - (*pdVar11 * (double)local_138._40_8_) / (double)local_138._32_8_;
            (*(pSVar7->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                      (pSVar7,(ulong)uVar2,&local_198,0);
          }
          VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b697e);
        }
      }
      for (local_19c = 0; uVar2 = local_19c,
          iVar9 = SVectorBase<double>::size((SVectorBase<double> *)local_138._48_8_),
          (int)uVar2 < iVar9; local_19c = local_19c + 1) {
        pcVar13 = SVectorBase<double>::index
                            ((SVectorBase<double> *)local_138._48_8_,(char *)(ulong)local_19c,__c_12
                            );
        pSVar7 = local_10;
        if ((int)pcVar13 != local_70[0]) {
          pcVar13 = SVectorBase<double>::index
                              ((SVectorBase<double> *)local_138._48_8_,(char *)(ulong)local_19c,
                               __c_13);
          SVectorBase<double>::index
                    ((SVectorBase<double> *)local_138._48_8_,(char *)(ulong)local_19c,__c_14);
          pdVar11 = SPxLPBase<double>::maxObj
                              (in_stack_fffffffffffffa80,
                               (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          dVar16 = *pdVar11;
          pdVar11 = SPxLPBase<double>::maxObj
                              (in_stack_fffffffffffffa80,
                               (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          dVar1 = *pdVar11;
          pdVar11 = SVectorBase<double>::value((SVectorBase<double> *)local_138._48_8_,local_19c);
          local_1a8 = dVar16 - (dVar1 * *pdVar11) / (double)local_138._32_8_;
          (*(pSVar7->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x27])
                    (pSVar7,(ulong)pcVar13 & 0xffffffff,&local_1a8,0);
        }
      }
      local_20 = local_20 + 1;
      pSVar12 = SPxLPBase<double>::colVector
                          (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20)
                          );
      iVar9 = SVectorBase<double>::size(pSVar12);
      local_24 = local_24 + iVar9;
      removeCol(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
      local_1c = local_1c + 1;
      pSVar12 = SPxLPBase<double>::rowVector
                          (in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20)
                          );
      iVar9 = SVectorBase<double>::size(pSVar12);
      local_24 = local_24 + iVar9;
      removeRow(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
      piVar14 = DataArray<int>::operator[](&in_RDI->m_stat,0x10);
      *piVar14 = *piVar14 + 1;
      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x2b6bd6);
    }
  }
  goto LAB_002b5047;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}